

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel_service.hpp
# Opt level: O3

int __thiscall
asio::experimental::detail::channel_service<asio::detail::null_mutex>::shutdown
          (channel_service<asio::detail::null_mutex> *this,int __fd,int __how)

{
  channel_operation *pcVar1;
  int extraout_EAX;
  base_implementation_type *pbVar2;
  channel_operation *pcVar3;
  op_queue<asio::experimental::detail::channel_operation> ops;
  channel_operation local_28;
  
  local_28.next_ = (channel_operation *)0x0;
  local_28.func_ = (func_type)0x0;
  pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  pbVar2 = this->impl_list_;
  if (pbVar2 != (base_implementation_type *)0x0) {
    pcVar3 = (channel_operation *)0x0;
    do {
      pcVar1 = (pbVar2->waiters_).front_;
      if (pcVar1 != (channel_operation *)0x0) {
        if (pcVar3 == (channel_operation *)0x0) {
          pcVar3 = &local_28;
        }
        pcVar3->next_ = pcVar1;
        pcVar3 = (pbVar2->waiters_).back_;
        (pbVar2->waiters_).front_ = (channel_operation *)0x0;
        (pbVar2->waiters_).back_ = (channel_operation *)0x0;
        local_28.func_ = (func_type)pcVar3;
      }
      pbVar2 = pbVar2->next_;
    } while (pbVar2 != (base_implementation_type *)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  asio::detail::op_queue<asio::experimental::detail::channel_operation>::~op_queue
            ((op_queue<asio::experimental::detail::channel_operation> *)&local_28);
  return extraout_EAX;
}

Assistant:

inline void channel_service<Mutex>::shutdown()
{
  // Abandon all pending operations.
  asio::detail::op_queue<channel_operation> ops;
  asio::detail::mutex::scoped_lock lock(mutex_);
  base_implementation_type* impl = impl_list_;
  while (impl)
  {
    ops.push(impl->waiters_);
    impl = impl->next_;
  }
}